

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadPackedFixed<unsigned_long>
          (EpsCopyInputStream *this,char *ptr,int size,RepeatedField<unsigned_long> *out)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer puVar4;
  char *pcVar5;
  LogMessage *this_00;
  uint uVar6;
  int n;
  string_view str;
  SooRep *local_50;
  int local_44;
  LogMessage local_40;
  
  if (ptr != (char *)0x0) {
    local_50 = &out->soo_rep_;
    uVar2 = BytesAvailable(this,ptr);
    do {
      if (size <= (int)uVar2) {
        uVar2 = size & 0xfffffff8;
        if (7 < (uint)size) {
          n = size >> 3;
          iVar3 = SooRep::size(local_50,(undefined1  [16])
                                        ((undefined1  [16])local_50->field_0 & (undefined1  [16])0x4
                                        ) == (undefined1  [16])0x0);
          RepeatedField<unsigned_long>::Reserve((RepeatedField<unsigned_long> *)local_50,iVar3 + n);
          puVar4 = RepeatedField<unsigned_long>::AddNAlreadyReserved
                             ((RepeatedField<unsigned_long> *)local_50,n);
          if (puVar4 == (pointer)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x4ea,"dst != nullptr");
            this_00 = absl::lts_20250127::log_internal::LogMessage::
                      operator<<<google::protobuf::RepeatedField<unsigned_long>_*,_0>
                                (&local_40,(RepeatedField<unsigned_long> **)&local_50);
            str._M_str = ",";
            str._M_len = 1;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (this_00,str);
            local_44 = n;
            absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_00,&local_44);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_40);
          }
          memcpy(puVar4,ptr,(long)(int)uVar2);
          ptr = ptr + (int)uVar2;
        }
        if (size != uVar2) {
          return (char *)0x0;
        }
        return ptr;
      }
      iVar3 = SooRep::size(local_50,(undefined1  [16])
                                    ((undefined1  [16])local_50->field_0 & (undefined1  [16])0x4) ==
                                    (undefined1  [16])0x0);
      RepeatedField<unsigned_long>::Reserve
                ((RepeatedField<unsigned_long> *)local_50,iVar3 + ((int)uVar2 >> 3));
      uVar6 = uVar2 & 0xfffffff8;
      puVar4 = RepeatedField<unsigned_long>::AddNAlreadyReserved
                         ((RepeatedField<unsigned_long> *)local_50,(int)uVar2 >> 3);
      memcpy(puVar4,ptr,(long)(int)uVar6);
      if (this->limit_ < 0x11) {
        bVar1 = false;
      }
      else {
        pcVar5 = Next(this);
        if (pcVar5 == (char *)0x0) {
          bVar1 = false;
          ptr = (char *)0x0;
        }
        else {
          ptr = pcVar5 + (0x10 - (uVar2 & 7));
          uVar2 = BytesAvailable(this,ptr);
          bVar1 = true;
        }
      }
      size = size - uVar6;
    } while (bVar1);
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::ReadPackedFixed(const char* ptr, int size,
                                                RepeatedField<T>* out) {
  GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
  int nbytes = BytesAvailable(ptr);
  while (size > nbytes) {
    int num = nbytes / sizeof(T);
    int old_entries = out->size();
    out->Reserve(old_entries + num);
    int block_size = num * sizeof(T);
    auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
    std::memcpy(dst, ptr, block_size);
#else
    for (int i = 0; i < num; i++)
      dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
    size -= block_size;
    if (limit_ <= kSlopBytes) return nullptr;
    ptr = Next();
    if (ptr == nullptr) return nullptr;
    ptr += kSlopBytes - (nbytes - block_size);
    nbytes = BytesAvailable(ptr);
  }
  int num = size / sizeof(T);
  int block_size = num * sizeof(T);
  if (num == 0) return size == block_size ? ptr : nullptr;
  int old_entries = out->size();
  out->Reserve(old_entries + num);
  auto dst = out->AddNAlreadyReserved(num);
#ifdef ABSL_IS_LITTLE_ENDIAN
  ABSL_CHECK(dst != nullptr) << out << "," << num;
  std::memcpy(dst, ptr, block_size);
#else
  for (int i = 0; i < num; i++) dst[i] = UnalignedLoad<T>(ptr + i * sizeof(T));
#endif
  ptr += block_size;
  if (size != block_size) return nullptr;
  return ptr;
}